

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::SweepWeakReference(Recycler *this)

{
  RecyclerWeakReferenceBase **ppRVar1;
  HeapAllocator *this_00;
  code *pcVar2;
  SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *buffer;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  HeapBlock *pHVar8;
  Type *ppRVar9;
  void *address;
  uint uVar10;
  ulong uVar11;
  Type pRVar12;
  RecyclerWeakReferenceBase *pRVar13;
  Type pRVar14;
  Type TVar15;
  uint uVar16;
  undefined1 local_60 [8];
  EditingIterator edIt;
  byte local_38;
  
  uVar4 = (this->weakReferenceMap).size;
  if (uVar4 == 0) {
    uVar4 = (this->weakReferenceMap).count;
    local_38 = 0;
    uVar16 = 0;
    uVar10 = 0;
  }
  else {
    local_38 = 0;
    uVar11 = 0;
    uVar16 = 0;
    uVar10 = 0;
    do {
      ppRVar1 = (this->weakReferenceMap).buckets;
      pRVar13 = ppRVar1[uVar11];
      if (pRVar13 != (RecyclerWeakReferenceBase *)0x0) {
        ppRVar9 = ppRVar1 + uVar11;
        do {
          iVar5 = (*pRVar13->weakRefHeapBlock->_vptr_HeapBlock[0xb])
                            (pRVar13->weakRefHeapBlock,pRVar13);
          if ((char)iVar5 == '\0') {
LAB_00710a6d:
            pRVar14 = pRVar13->next;
            *ppRVar9 = pRVar14;
            uVar10 = uVar10 + 1;
            local_38 = 1;
          }
          else {
            iVar5 = (*pRVar13->strongRefHeapBlock->_vptr_HeapBlock[0xb])
                              (pRVar13->strongRefHeapBlock,pRVar13->strongRef);
            if ((char)iVar5 == '\0') {
              pRVar13->strongRef = (Type)0x0;
              pRVar13->strongRefHeapBlock =
                   &CollectedRecyclerWeakRefHeapBlock::Instance.super_HeapBlock;
              goto LAB_00710a6d;
            }
            uVar16 = uVar16 + 1;
            pRVar14 = pRVar13->next;
            ppRVar9 = &pRVar13->next;
          }
          pRVar13 = pRVar14;
        } while (pRVar14 != (Type)0x0);
        uVar4 = (this->weakReferenceMap).size;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar4);
    uVar4 = (this->weakReferenceMap).count;
    if (uVar4 < uVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                         ,0x107,"(removed <= count)","removed <= count");
      if (!bVar3) goto LAB_00710d0d;
      *puVar6 = 0;
      uVar4 = (this->weakReferenceMap).count;
    }
  }
  (this->weakReferenceMap).count = uVar4 - uVar10;
  if (uVar16 != uVar4 - uVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x10b,"(countedEntries == count)","countedEntries == count");
    if (!bVar3) {
LAB_00710d0d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  local_60 = (undefined1  [8])&this->weakReferenceRegionList;
  edIt.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  edIt.super_EditingIterator.super_Iterator.list =
       (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)local_60;
  bVar3 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
          EditingIterator::Next((EditingIterator *)local_60);
  if (bVar3) {
    edIt.super_EditingIterator.last = (NodeBase *)&this->heapBlockMap;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pTVar7 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
               Iterator::Data((Iterator *)local_60);
      pRVar12 = pTVar7->ptr;
      TVar15 = pTVar7->count;
      iVar5 = (*pTVar7->arrayHeapBlock->_vptr_HeapBlock[0xb])(pTVar7->arrayHeapBlock,pRVar12);
      buffer = edIt.super_EditingIterator.super_Iterator.list;
      if ((char)iVar5 == '\0') {
        this_00 = (HeapAllocator *)
                  (((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>
                     *)((long)local_60 + 0x10))->super_SListNodeBase<Memory::HeapAllocator>).next;
        SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
        EditingIterator::UnlinkCurrentNode((EditingIterator *)local_60);
        HeapAllocator::Free(this_00,buffer,0x20);
        local_38 = 1;
      }
      else if (TVar15 != 0) {
        pRVar12 = pRVar12 + 8;
        do {
          address = *(void **)(pRVar12 + -8);
          if (address != (void *)0x0) {
            pHVar8 = *(HeapBlock **)pRVar12;
            if (((ulong)pHVar8 & 1) == 0) {
              if (pHVar8 == (HeapBlock *)0x0) {
                if ((((ulong)address & 0xf) != 0 || address < (void *)0x10000) ||
                   (pHVar8 = HeapBlockMap64::GetHeapBlock
                                       ((HeapBlockMap64 *)edIt.super_EditingIterator.last,address),
                   pHVar8 == (HeapBlock *)0x0)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar6 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                                     ,0xcb0,"(false)",
                                     "WeakReferenceRegionItems should only contain recycler references"
                                    );
                  if (bVar3) {
                    *puVar6 = 0;
                    goto LAB_00710cab;
                  }
                  goto LAB_00710d0d;
                }
                *(HeapBlock **)pRVar12 = pHVar8;
                address = *(void **)(pRVar12 + -8);
              }
              iVar5 = (*pHVar8->_vptr_HeapBlock[0xb])(pHVar8,address);
              if ((char)iVar5 == '\0') {
                *(ulong *)(pRVar12 + -8) = 0;
                *(ulong *)pRVar12 = 0;
                local_38 = 1;
              }
            }
            else {
              *(ulong *)pRVar12 = (ulong)pHVar8 & 0xfffffffffffffffe;
            }
          }
LAB_00710cab:
          pRVar12 = pRVar12 + 0x10;
          TVar15 = TVar15 - 1;
        } while (TVar15 != 0);
      }
      bVar3 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_60);
    } while (bVar3);
  }
  this->weakReferenceCleanupId = this->weakReferenceCleanupId + (uint)local_38;
  return;
}

Assistant:

void
Recycler::SweepWeakReference()
{
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::SweepWeakPhase);
    GCETW(GC_SWEEP_WEAKREF_START, (this));

    // REVIEW: Clean up the weak reference map concurrently?
    bool hasCleanup = false;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
    uint scannedCount = weakReferenceMap.Count();
#endif

    weakReferenceMap.Map([&hasCleanup](RecyclerWeakReferenceBase * weakRef) -> bool
    {
        if (!weakRef->weakRefHeapBlock->TestObjectMarkedBit(weakRef))
        {
            hasCleanup = true;

            // Remove
            return false;
        }

        if (!weakRef->strongRefHeapBlock->TestObjectMarkedBit(weakRef->strongRef))
        {
            hasCleanup = true;
            weakRef->strongRef = nullptr;

            // Put in a dummy heap block so that we can still do the isPendingConcurrentSweep check first.
            weakRef->strongRefHeapBlock = &CollectedRecyclerWeakRefHeapBlock::Instance;

            // Remove
            return false;
        }

        return true;
    });

#if defined(GCETW) && defined(ENABLE_JS_ETW)
    uint regionScannedCount = 0;
    uint regionClearedCount = 0;
#endif

#if ENABLE_WEAK_REFERENCE_REGIONS

    auto edIt = this->weakReferenceRegionList.GetEditingIterator();
    while (edIt.Next())
    {
        RecyclerWeakReferenceRegion region = edIt.Data();
        // We want to see if user code has any reference to the region, if not, we can free the whole thing
        if (!region.GetHeapBlock()->TestObjectMarkedBit(region.GetPtr()))
        {
            edIt.RemoveCurrent();
            hasCleanup = true;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
            regionClearedCount += (uint)region.GetCount();
#endif
            continue;
        }

        // The region is referenced, clean up any stale weak references
        RecyclerWeakReferenceRegionItem<void*>* refs = region.GetPtr();
#if defined(GCETW) && defined(ENABLE_JS_ETW)
        regionScannedCount += (uint)region.GetCount();
#endif
        for (size_t i = 0; i < region.GetCount(); ++i)
        {
            RecyclerWeakReferenceRegionItem<void*> &ref = refs[i];
            if (ref.ptr == nullptr)
            {
                continue;
            }

            if (((uintptr_t)ref.heapBlock & 0x1) == 0x1)
            {
                // Background thread marked this ref. Unmark it, and keep it
                ref.heapBlock = (HeapBlock*)((uintptr_t)ref.heapBlock & ~0x1);
                continue;
            }

            if (ref.heapBlock == nullptr)
            {
                HeapBlock* block = this->FindHeapBlock(ref.ptr);
                if (block == nullptr)
                {
                    // This is not a real reference
                    AssertMsg(false, "WeakReferenceRegionItems should only contain recycler references");
                    continue;
                }
                else
                {
                    ref.heapBlock = block;
                }
            }

            if (!ref.heapBlock->TestObjectMarkedBit(ref))
            {
                ref.ptr = nullptr;
                ref.heapBlock = nullptr;
                hasCleanup = true;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
                regionClearedCount++;
#endif
            }
        }
    }
#endif

    this->weakReferenceCleanupId += hasCleanup;

#if defined(GCETW) && defined(ENABLE_JS_ETW)
    const uint keptCount = weakReferenceMap.Count();
    GCETW(GC_SWEEP_WEAKREF_STOP_EX, (this, scannedCount, (scannedCount - keptCount), regionScannedCount, regionClearedCount));
#endif

    RECYCLER_PROFILE_EXEC_END(this, Js::SweepWeakPhase);
}